

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

uint8 * __thiscall
sentencepiece::SentencePieceText::_InternalSerialize
          (SentencePieceText *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  float fVar3;
  SentencePieceText_SentencePiece *this_00;
  void *pvVar4;
  void *pvVar5;
  bool bVar6;
  uint8 *puVar7;
  uint8 *puVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  undefined8 *puVar12;
  size_t __n;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->text_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  iVar2 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (SentencePieceText_SentencePiece *)
                ((this->pieces_).super_RepeatedPtrFieldBase.rep_)->elements[iVar11];
      *target = '\x12';
      uVar9 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar9 < 0x80) {
        target[1] = (byte)uVar9;
        puVar7 = target + 2;
      }
      else {
        target[1] = (byte)uVar9 | 0x80;
        if (uVar9 < 0x4000) {
          target[2] = (uint8)(uVar9 >> 7);
          puVar7 = target + 3;
        }
        else {
          puVar7 = target + 3;
          uVar9 = uVar9 >> 7;
          do {
            puVar8 = puVar7;
            puVar8[-1] = (byte)uVar9 | 0x80;
            uVar10 = uVar9 >> 7;
            puVar7 = puVar8 + 1;
            bVar6 = 0x3fff < uVar9;
            uVar9 = uVar10;
          } while (bVar6);
          *puVar8 = (uint8)uVar10;
        }
      }
      target = SentencePieceText_SentencePiece::_InternalSerialize(this_00,puVar7,stream);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar2);
  }
  if ((uVar1 & 2) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    fVar3 = this->score_;
    *target = '\x1d';
    *(float *)(target + 1) = fVar3;
    target = target + 5;
  }
  puVar7 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    pvVar4 = *(void **)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
    pvVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pvVar5 & 1) == 0) {
      puVar12 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar12 = (undefined8 *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 8);
    }
    __n = (size_t)(int)puVar12[1];
    if ((long)stream->end_ - (long)puVar7 < (long)__n) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar4,(int)puVar12[1],puVar7);
      return puVar7;
    }
    memcpy(puVar7,pvVar4,__n);
    puVar7 = puVar7 + __n;
  }
  return puVar7;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SentencePieceText::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string text = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_text(), target);
  }

  // repeated .sentencepiece.SentencePieceText.SentencePiece pieces = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_pieces_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(2, this->_internal_pieces(i), target, stream);
  }

  // optional float score = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(3, this->_internal_score(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.SentencePieceText)
  return target;
}